

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalCreateTable::Deserialize(LogicalCreateTable *this,Deserializer *deserializer)

{
  int iVar1;
  LogicalCreateTable *this_00;
  ClientContext *context;
  CreateInfo *pCVar2;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_30;
  CreateInfo *local_28;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"info");
  pCVar2 = (CreateInfo *)0x0;
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      pCVar2 = (CreateInfo *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      CreateInfo::Deserialize((CreateInfo *)&stack0xffffffffffffffd8,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pCVar2 = local_28;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (LogicalCreateTable *)operator_new(0x78);
  context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  local_30._M_head_impl = pCVar2;
  LogicalCreateTable(this_00,context,
                     (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                      *)&local_30);
  if (local_30._M_head_impl != (CreateInfo *)0x0) {
    (*((local_30._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalCreateTable::Deserialize(Deserializer &deserializer) {
	auto info = deserializer.ReadPropertyWithDefault<unique_ptr<CreateInfo>>(200, "info");
	auto result = duckdb::unique_ptr<LogicalCreateTable>(new LogicalCreateTable(deserializer.Get<ClientContext &>(), std::move(info)));
	return std::move(result);
}